

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinImporter::InternReadFile
          (AssbinImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  unsigned_short uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  void *pvVar6;
  undefined4 extraout_var_02;
  void *pvVar7;
  runtime_error *prVar8;
  ulong uVar9;
  MemoryIOStream io;
  uLongf uncompressedSize;
  IOStream local_68;
  void *local_60;
  _func_int *local_58;
  undefined8 local_50;
  char local_48;
  _func_int *local_40;
  aiScene *local_38;
  IOStream *stream;
  
  local_68._vptr_IOStream = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"rb","");
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,local_68._vptr_IOStream);
  stream = (IOStream *)CONCAT44(extraout_var,iVar2);
  if (local_68._vptr_IOStream != &local_58) {
    operator_delete(local_68._vptr_IOStream);
  }
  if (stream != (IOStream *)0x0) {
    (*stream->_vptr_IOStream[4])(stream,0x2c,1);
    uVar3 = Read<unsigned_int>(stream);
    uVar4 = Read<unsigned_int>(stream);
    if ((uVar3 != 1) || (uVar4 != 0)) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._vptr_IOStream = &local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Invalid version, data format not compatible!","");
      std::runtime_error::runtime_error(prVar8,(string *)&local_68);
      *(undefined ***)prVar8 = &PTR__runtime_error_00875f28;
      __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    Read<unsigned_int>(stream);
    Read<unsigned_int>(stream);
    uVar1 = Read<unsigned_short>(stream);
    this->shortened = uVar1 != 0;
    uVar1 = Read<unsigned_short>(stream);
    this->compressed = uVar1 != 0;
    if (this->shortened == true) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._vptr_IOStream = &local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Shortened binaries are not supported!","");
      std::runtime_error::runtime_error(prVar8,(string *)&local_68);
      *(undefined ***)prVar8 = &PTR__runtime_error_00875f28;
      __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_IOStream[4])(stream,0x100,1);
    (*stream->_vptr_IOStream[4])(stream,0x80,1);
    (*stream->_vptr_IOStream[4])(stream,0x40,1);
    if (this->compressed == true) {
      local_38 = pScene;
      uVar3 = Read<unsigned_int>(stream);
      local_40 = (_func_int *)(ulong)uVar3;
      iVar2 = (*stream->_vptr_IOStream[6])(stream);
      iVar5 = (*stream->_vptr_IOStream[5])(stream);
      uVar9 = CONCAT44(extraout_var_00,iVar2) - CONCAT44(extraout_var_01,iVar5);
      pvVar6 = operator_new__(uVar9);
      iVar2 = (*stream->_vptr_IOStream[2])(stream,pvVar6,1,uVar9);
      if (CONCAT44(extraout_var_02,iVar2) != uVar9) {
        __assert_fail("len == compressedSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Assbin/AssbinLoader.cpp"
                      ,0x2c3,
                      "virtual void Assimp::AssbinImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      pvVar7 = operator_new__((ulong)uVar3);
      iVar2 = uncompress(pvVar7,&local_40,pvVar6,uVar9);
      if (iVar2 != 0) {
        operator_delete__(pvVar7);
        operator_delete__(pvVar6);
        (*pIOHandler->_vptr_IOSystem[5])(pIOHandler,stream);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_68._vptr_IOStream = &local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Zlib decompression failed.","");
        std::runtime_error::runtime_error(prVar8,(string *)&local_68);
        *(undefined ***)prVar8 = &PTR__runtime_error_00875f28;
        __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_68._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_00875cd0;
      local_58 = local_40;
      local_50 = 0;
      local_48 = '\0';
      local_60 = pvVar7;
      ReadBinaryScene(this,&local_68,local_38);
      operator_delete__(pvVar7);
      operator_delete__(pvVar6);
      local_68._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_00875cd0;
      if ((local_48 == '\x01') && (local_60 != (void *)0x0)) {
        operator_delete__(local_60);
      }
    }
    else {
      ReadBinaryScene(this,stream,pScene);
    }
    (*pIOHandler->_vptr_IOSystem[5])(pIOHandler,stream);
  }
  return;
}

Assistant:

void AssbinImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler ) {
    IOStream * stream = pIOHandler->Open(pFile,"rb");
    if (nullptr == stream) {
        return;
    }

    // signature
    stream->Seek( 44, aiOrigin_CUR );

    unsigned int versionMajor = Read<unsigned int>(stream);
    unsigned int versionMinor = Read<unsigned int>(stream);
    if (versionMinor != ASSBIN_VERSION_MINOR || versionMajor != ASSBIN_VERSION_MAJOR) {
        throw DeadlyImportError( "Invalid version, data format not compatible!" );
    }

    /*unsigned int versionRevision =*/ Read<unsigned int>(stream);
    /*unsigned int compileFlags =*/ Read<unsigned int>(stream);

    shortened = Read<uint16_t>(stream) > 0;
    compressed = Read<uint16_t>(stream) > 0;

    if (shortened)
        throw DeadlyImportError( "Shortened binaries are not supported!" );

    stream->Seek( 256, aiOrigin_CUR ); // original filename
    stream->Seek( 128, aiOrigin_CUR ); // options
    stream->Seek( 64, aiOrigin_CUR ); // padding

    if (compressed) {
        uLongf uncompressedSize = Read<uint32_t>(stream);
        uLongf compressedSize = static_cast<uLongf>(stream->FileSize() - stream->Tell());

        unsigned char * compressedData = new unsigned char[ compressedSize ];
        size_t len = stream->Read( compressedData, 1, compressedSize );
        ai_assert(len == compressedSize);

        unsigned char * uncompressedData = new unsigned char[ uncompressedSize ];

        int res = uncompress( uncompressedData, &uncompressedSize, compressedData, (uLong) len );
        if(res != Z_OK)
        {
            delete [] uncompressedData;
            delete [] compressedData;
            pIOHandler->Close(stream);
            throw DeadlyImportError("Zlib decompression failed.");
        }

        MemoryIOStream io( uncompressedData, uncompressedSize );

        ReadBinaryScene(&io,pScene);

        delete[] uncompressedData;
        delete[] compressedData;
    } else {
        ReadBinaryScene(stream,pScene);
    }

    pIOHandler->Close(stream);
}